

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::right_rotate
          (map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this,Node *x)

{
  Node *pNVar1;
  Node *y;
  Node *x_local;
  map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this_local;
  
  pNVar1 = x->parent;
  if (x->right != this->nil) {
    x->right->parent = pNVar1;
  }
  pNVar1->left = x->right;
  if (pNVar1->parent->left == pNVar1) {
    pNVar1->parent->left = x;
  }
  else {
    pNVar1->parent->right = x;
  }
  x->parent = pNVar1->parent;
  pNVar1->parent = x;
  x->right = pNVar1;
  return;
}

Assistant:

void right_rotate(Node *x)
	{
		Node *y = x -> parent;
		if (x -> right != nil) x -> right -> parent = y;
		y -> left = x -> right;
		if (y -> parent -> left == y) y -> parent -> left = x;
		else y -> parent -> right = x;
		x -> parent = y -> parent , y -> parent = x , x -> right = y;
	}